

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

void __thiscall
node::BlockManager::BlockManager(BlockManager *this,SignalInterrupt *interrupt,Options opts)

{
  _Rb_tree_header *p_Var1;
  path *__p;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  vector<std::byte,_std::allocator<std::byte>_> data_xor_00;
  path dir;
  path dir_00;
  char cVar2;
  bool bVar3;
  FILE *pFVar4;
  runtime_error *this_00;
  BlockManagerOpts *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  Span<std::byte> output;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view source_file;
  string_view logging_function;
  pointer pbVar5;
  pointer pbVar6;
  pointer pbVar7;
  undefined1 in_stack_fffffffffffffe50 [16];
  path local_180;
  string local_158;
  string local_138;
  path local_118;
  path xor_key_path;
  AutoFile xor_key_file;
  array<std::byte,_8UL> xor_key;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list
  .__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex +
   0x10) = 0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list
  .__prev = (__pthread_internal_list *)0x0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8)
       = 0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind
       = 1;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_blockfile_cursors)._M_elems[0].super__Optional_base<node::BlockfileCursor,_true,_true>.
  _M_payload.super__Optional_payload_base<node::BlockfileCursor>._M_payload =
       (_Storage<node::BlockfileCursor,_true>)0x0;
  *(undefined8 *)
   &(this->m_blockfile_cursors)._M_elems[0].super__Optional_base<node::BlockfileCursor,_true,_true>.
    _M_payload.super__Optional_payload_base<node::BlockfileCursor>._M_engaged = 1;
  *(undefined8 *)
   ((long)&(this->m_blockfile_cursors)._M_elems[1].
           super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
           super__Optional_payload_base<node::BlockfileCursor>._M_payload + 4) = 0;
  this->m_check_for_pruning = false;
  this->m_prune_mode = in_RDX->prune_target != 0;
  xor_key._M_elems[0] = 0;
  xor_key._M_elems[1] = 0;
  xor_key._M_elems[2] = 0;
  xor_key._M_elems[3] = 0;
  xor_key._M_elems[4] = 0;
  xor_key._M_elems[5] = 0;
  xor_key._M_elems[6] = 0;
  xor_key._M_elems[7] = 0;
  if ((in_RDX->use_xor == true) &&
     (cVar2 = std::filesystem::is_empty((path *)&in_RDX->blocks_dir), cVar2 != '\0')) {
    FastRandomContext::FastRandomContext((FastRandomContext *)&xor_key_file,false);
    output.m_size = 8;
    output.m_data = xor_key._M_elems;
    FastRandomContext::fillrand((FastRandomContext *)&xor_key_file,output);
    ChaCha20::~ChaCha20((ChaCha20 *)
                        &xor_key_file.m_xor.
                         super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_finish);
  }
  std::filesystem::__cxx11::path::path(&local_118,&(in_RDX->blocks_dir).super_path);
  fs::path::operator/=((path *)&local_118,"xor.dat");
  std::filesystem::__cxx11::path::path(&xor_key_path.super_path,&local_118);
  std::filesystem::__cxx11::path::~path(&local_118);
  bVar3 = std::filesystem::exists(&xor_key_path.super_path);
  if (bVar3) {
    pFVar4 = fsbridge::fopen((char *)&xor_key_path,"rb");
    pbVar5 = (pointer)0x0;
    pbVar6 = (pointer)0x0;
    pbVar7 = (pointer)0x0;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    AutoFile::AutoFile(&xor_key_file,(FILE *)pFVar4,data_xor);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffe38);
    Unserialize<AutoFile,_std::byte,_8UL>(&xor_key_file,&xor_key);
  }
  else {
    pFVar4 = fsbridge::fopen((char *)&xor_key_path,"wbx");
    pbVar5 = (pointer)0x0;
    pbVar6 = (pointer)0x0;
    pbVar7 = (pointer)0x0;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data_xor_00.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    AutoFile::AutoFile(&xor_key_file,(FILE *)pFVar4,data_xor_00);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffe38);
    Serialize<AutoFile,_std::byte,_8UL>(&xor_key_file,&xor_key);
  }
  AutoFile::~AutoFile(&xor_key_file);
  if (in_RDX->use_xor == false) {
    xor_key_file.m_file = (FILE *)0x0;
    bVar3 = std::operator==(&xor_key,(array<std::byte,_8UL> *)&xor_key_file);
    if (!bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      s_00.m_size = 8;
      s_00.m_data = xor_key._M_elems;
      HexStr_abi_cxx11_(&local_138,s_00);
      std::filesystem::__cxx11::path::string(&local_158,&xor_key_path.super_path);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)&xor_key_file,
                 (tinyformat *)
                 "The blocksdir XOR-key can not be disabled when a random key was already stored! Stored key: \'%s\', stored path: \'%s\'."
                 ,(char *)&local_138,&local_158,in_R8);
      std::runtime_error::runtime_error(this_00,(string *)&xor_key_file);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0075f609;
    }
  }
  std::filesystem::__cxx11::path::string((string *)&xor_key_file,&(in_RDX->blocks_dir).super_path);
  s.m_size = 8;
  s.m_data = xor_key._M_elems;
  HexStr_abi_cxx11_(&local_138,s);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
  ;
  source_file._M_len = 0x65;
  logging_function._M_str = "InitBlocksdirXorKey";
  logging_function._M_len = 0x13;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function,source_file,0x498,ALL,Info,(ConstevalFormatString<2U>)0xc9e4e3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xor_key_file,
             &local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&xor_key_file);
  std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte*,void>
            ((vector<std::byte,std::allocator<std::byte>> *)&this->m_xor_key,xor_key._M_elems,
             (byte *)&local_38,(allocator_type *)&xor_key_file);
  std::filesystem::__cxx11::path::~path(&xor_key_path.super_path);
  p_Var1 = &(this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_prune_locks)._M_h._M_buckets = &(this->m_prune_locks)._M_h._M_single_bucket;
  (this->m_prune_locks)._M_h._M_bucket_count = 1;
  (this->m_prune_locks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_prune_locks)._M_h._M_element_count = 0;
  (this->m_prune_locks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_prune_locks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_prune_locks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  kernel::BlockManagerOpts::BlockManagerOpts(&this->m_opts,in_RDX);
  __p = &(this->m_opts).blocks_dir;
  std::filesystem::__cxx11::path::path(&local_180,&__p->super_path);
  dir.super_path._M_pathname._M_string_length = (size_type)pbVar6;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)pbVar5;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)pbVar7;
  dir.super_path._24_16_ = in_stack_fffffffffffffe50;
  FlatFileSeq::FlatFileSeq(&this->m_block_file_seq,dir,(char *)&local_180,0xcd23bd);
  std::filesystem::__cxx11::path::~path(&local_180);
  std::filesystem::__cxx11::path::path((path *)&stack0xfffffffffffffe58,&__p->super_path);
  dir_00.super_path._M_pathname._M_string_length = (size_type)pbVar6;
  dir_00.super_path._M_pathname._M_dataplus._M_p = (pointer)pbVar5;
  dir_00.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)pbVar7;
  dir_00.super_path._24_16_ = in_stack_fffffffffffffe50;
  FlatFileSeq::FlatFileSeq(&this->m_undo_file_seq,dir_00,&stack0xfffffffffffffe58,0xcc435a);
  std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffe58);
  this->m_interrupt = interrupt;
  this->m_importing = (__atomic_base<bool>)0x0;
  this->m_blockfiles_indexed = (__atomic_base<bool>)0x1;
  (this->m_block_index)._M_h._M_buckets = &(this->m_block_index)._M_h._M_single_bucket;
  (this->m_block_index)._M_h._M_bucket_count = 1;
  (this->m_block_index)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_block_index)._M_h._M_element_count = 0;
  (this->m_block_index)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_block_index)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_block_index)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_block_tree_db)._M_t.
  super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>._M_t.
  super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>.
  super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl = (BlockTreeDB *)0x0;
  this->m_have_pruned = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0075f609:
  __stack_chk_fail();
}

Assistant:

BlockManager::BlockManager(const util::SignalInterrupt& interrupt, Options opts)
    : m_prune_mode{opts.prune_target > 0},
      m_xor_key{InitBlocksdirXorKey(opts)},
      m_opts{std::move(opts)},
      m_block_file_seq{FlatFileSeq{m_opts.blocks_dir, "blk", m_opts.fast_prune ? 0x4000 /* 16kB */ : BLOCKFILE_CHUNK_SIZE}},
      m_undo_file_seq{FlatFileSeq{m_opts.blocks_dir, "rev", UNDOFILE_CHUNK_SIZE}},
      m_interrupt{interrupt} {}